

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  ulong *puVar27;
  undefined4 uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  uint uVar36;
  ulong unaff_R13;
  size_t mask;
  ulong uVar37;
  ulong uVar38;
  bool bVar39;
  uint uVar40;
  undefined1 auVar41 [16];
  uint uVar44;
  uint uVar45;
  undefined1 auVar42 [32];
  uint uVar46;
  undefined1 auVar43 [32];
  vint4 bi;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  vint4 ai;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  NodeRef stack [244];
  ulong *local_980;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_980 = local_7f8;
  local_800 = root.ptr;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar52._4_4_ = fVar1;
  auVar52._0_4_ = fVar1;
  auVar52._8_4_ = fVar1;
  auVar52._12_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar56._4_4_ = fVar2;
  auVar56._0_4_ = fVar2;
  auVar56._8_4_ = fVar2;
  auVar56._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar63._4_4_ = fVar3;
  auVar63._0_4_ = fVar3;
  auVar63._8_4_ = fVar3;
  auVar63._12_4_ = fVar3;
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  auVar65._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  auVar65._8_4_ = -fVar1;
  auVar65._12_4_ = -fVar1;
  auVar67._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar67._8_4_ = -fVar2;
  auVar67._12_4_ = -fVar2;
  iVar4 = (tray->tnear).field_0.i[k];
  auVar69._4_4_ = iVar4;
  auVar69._0_4_ = iVar4;
  auVar69._8_4_ = iVar4;
  auVar69._12_4_ = iVar4;
  auVar61._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar61._8_4_ = -fVar3;
  auVar61._12_4_ = -fVar3;
  iVar4 = (tray->tfar).field_0.i[k];
  auVar71._4_4_ = iVar4;
  auVar71._0_4_ = iVar4;
  auVar71._8_4_ = iVar4;
  auVar71._12_4_ = iVar4;
  auVar42._8_4_ = 0x80000000;
  auVar42._0_8_ = 0x8000000080000000;
  auVar42._12_4_ = 0x80000000;
  auVar42._16_4_ = 0x80000000;
  auVar42._20_4_ = 0x80000000;
  auVar42._24_4_ = 0x80000000;
  auVar42._28_4_ = 0x80000000;
  do {
    puVar27 = local_980;
    auVar60 = ZEXT1664(auVar56);
    if (local_980 == &local_800) break;
    uVar38 = local_980[-1];
    local_980 = local_980 + -1;
    do {
      if ((uVar38 & 8) == 0) {
        auVar41 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar32),auVar65,auVar52);
        auVar16 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar33),auVar67,auVar56);
        auVar41 = vpmaxsd_avx(auVar41,auVar16);
        auVar16 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar34),auVar61,auVar63);
        auVar16 = vpmaxsd_avx(auVar16,auVar69);
        auVar41 = vpmaxsd_avx(auVar41,auVar16);
        auVar16 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar38 + 0x20 + (uVar32 ^ 0x10)),auVar65,
                                  auVar52);
        auVar17 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar38 + 0x20 + (uVar33 ^ 0x10)),auVar67,
                                  auVar56);
        auVar16 = vpminsd_avx(auVar16,auVar17);
        auVar17 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar38 + 0x20 + (uVar34 ^ 0x10)),auVar61,
                                  auVar63);
        auVar17 = vpminsd_avx(auVar17,auVar71);
        auVar16 = vpminsd_avx(auVar16,auVar17);
        auVar41 = vpcmpgtd_avx(auVar41,auVar16);
        uVar28 = vmovmskps_avx(auVar41);
        unaff_R13 = (ulong)(byte)((byte)uVar28 ^ 0xf);
      }
      if ((uVar38 & 8) == 0) {
        if (unaff_R13 == 0) {
          uVar36 = 4;
        }
        else {
          uVar37 = uVar38 & 0xfffffffffffffff0;
          lVar35 = 0;
          for (uVar38 = unaff_R13; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
            lVar35 = lVar35 + 1;
          }
          uVar36 = 0;
          for (uVar29 = unaff_R13 - 1 & unaff_R13; uVar38 = *(ulong *)(uVar37 + lVar35 * 8),
              uVar29 != 0; uVar29 = uVar29 - 1 & uVar29) {
            *local_980 = uVar38;
            local_980 = local_980 + 1;
            lVar35 = 0;
            for (uVar38 = uVar29; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
              lVar35 = lVar35 + 1;
            }
          }
        }
      }
      else {
        uVar36 = 6;
      }
    } while (uVar36 == 0);
    if (uVar36 == 6) {
      uVar37 = (ulong)((uint)uVar38 & 0xf);
      uVar36 = 0;
      uVar29 = uVar37 - 8;
      bVar39 = uVar37 != 8;
      if (bVar39) {
        uVar28 = *(undefined4 *)(ray + k * 4);
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x20);
        uVar6 = *(undefined4 *)(ray + k * 4 + 0x40);
        fVar1 = *(float *)(ray + k * 4 + 0x80);
        auVar74._4_4_ = fVar1;
        auVar74._0_4_ = fVar1;
        auVar74._8_4_ = fVar1;
        auVar74._12_4_ = fVar1;
        auVar74._16_4_ = fVar1;
        auVar74._20_4_ = fVar1;
        auVar74._24_4_ = fVar1;
        auVar74._28_4_ = fVar1;
        fVar2 = *(float *)(ray + k * 4 + 0xa0);
        auVar75._4_4_ = fVar2;
        auVar75._0_4_ = fVar2;
        auVar75._8_4_ = fVar2;
        auVar75._12_4_ = fVar2;
        auVar75._16_4_ = fVar2;
        auVar75._20_4_ = fVar2;
        auVar75._24_4_ = fVar2;
        auVar75._28_4_ = fVar2;
        uVar38 = uVar38 & 0xfffffffffffffff0;
        fVar3 = *(float *)(ray + k * 4 + 0xc0);
        auVar68._4_4_ = fVar3;
        auVar68._0_4_ = fVar3;
        auVar68._8_4_ = fVar3;
        auVar68._12_4_ = fVar3;
        auVar68._16_4_ = fVar3;
        auVar68._20_4_ = fVar3;
        auVar68._24_4_ = fVar3;
        auVar68._28_4_ = fVar3;
        uVar37 = 0;
        do {
          lVar30 = uVar37 * 0xe0;
          lVar35 = uVar38 + 0xc0 + lVar30;
          local_820 = *(undefined8 *)(lVar35 + 0x10);
          uStack_818 = *(undefined8 *)(lVar35 + 0x18);
          uStack_810 = local_820;
          uStack_808 = uStack_818;
          auVar62._16_16_ = *(undefined1 (*) [16])(uVar38 + 0x60 + lVar30);
          auVar62._0_16_ = *(undefined1 (*) [16])(uVar38 + lVar30);
          auVar66._16_16_ = *(undefined1 (*) [16])(uVar38 + 0x70 + lVar30);
          auVar66._0_16_ = *(undefined1 (*) [16])(uVar38 + 0x10 + lVar30);
          auVar73._16_16_ = *(undefined1 (*) [16])(uVar38 + 0x80 + lVar30);
          auVar73._0_16_ = *(undefined1 (*) [16])(uVar38 + 0x20 + lVar30);
          auVar41 = *(undefined1 (*) [16])(uVar38 + 0x30 + lVar30);
          auVar49._16_16_ = auVar41;
          auVar49._0_16_ = auVar41;
          auVar41 = *(undefined1 (*) [16])(uVar38 + 0x40 + lVar30);
          auVar47._16_16_ = auVar41;
          auVar47._0_16_ = auVar41;
          auVar41 = *(undefined1 (*) [16])(uVar38 + 0x50 + lVar30);
          auVar50._16_16_ = auVar41;
          auVar50._0_16_ = auVar41;
          auVar41 = *(undefined1 (*) [16])(uVar38 + 0x90 + lVar30);
          auVar70._16_16_ = auVar41;
          auVar70._0_16_ = auVar41;
          auVar16 = *(undefined1 (*) [16])(uVar38 + 0xa0 + lVar30);
          auVar72._16_16_ = auVar16;
          auVar72._0_16_ = auVar16;
          auVar17 = *(undefined1 (*) [16])(uVar38 + 0xb0 + lVar30);
          auVar53._16_16_ = auVar17;
          auVar53._0_16_ = auVar17;
          auVar8 = vsubps_avx(auVar62,auVar49);
          auVar49 = vsubps_avx(auVar66,auVar47);
          auVar9 = vsubps_avx(auVar73,auVar50);
          auVar47 = vsubps_avx(auVar70,auVar62);
          auVar43 = vsubps_avx(auVar72,auVar66);
          auVar10 = vsubps_avx(auVar53,auVar73);
          auVar11._4_4_ = auVar49._4_4_ * auVar10._4_4_;
          auVar11._0_4_ = auVar49._0_4_ * auVar10._0_4_;
          auVar11._8_4_ = auVar49._8_4_ * auVar10._8_4_;
          auVar11._12_4_ = auVar49._12_4_ * auVar10._12_4_;
          auVar11._16_4_ = auVar49._16_4_ * auVar10._16_4_;
          auVar11._20_4_ = auVar49._20_4_ * auVar10._20_4_;
          auVar11._24_4_ = auVar49._24_4_ * auVar10._24_4_;
          auVar11._28_4_ = auVar41._12_4_;
          auVar18 = vfmsub231ps_fma(auVar11,auVar43,auVar9);
          auVar12._4_4_ = auVar47._4_4_ * auVar9._4_4_;
          auVar12._0_4_ = auVar47._0_4_ * auVar9._0_4_;
          auVar12._8_4_ = auVar47._8_4_ * auVar9._8_4_;
          auVar12._12_4_ = auVar47._12_4_ * auVar9._12_4_;
          auVar12._16_4_ = auVar47._16_4_ * auVar9._16_4_;
          auVar12._20_4_ = auVar47._20_4_ * auVar9._20_4_;
          auVar12._24_4_ = auVar47._24_4_ * auVar9._24_4_;
          auVar12._28_4_ = auVar16._12_4_;
          auVar19 = vfmsub231ps_fma(auVar12,auVar10,auVar8);
          auVar26._4_4_ = uVar28;
          auVar26._0_4_ = uVar28;
          auVar26._8_4_ = uVar28;
          auVar26._12_4_ = uVar28;
          auVar26._16_4_ = uVar28;
          auVar26._20_4_ = uVar28;
          auVar26._24_4_ = uVar28;
          auVar26._28_4_ = uVar28;
          auVar11 = vsubps_avx(auVar62,auVar26);
          auVar25._4_4_ = uVar5;
          auVar25._0_4_ = uVar5;
          auVar25._8_4_ = uVar5;
          auVar25._12_4_ = uVar5;
          auVar25._16_4_ = uVar5;
          auVar25._20_4_ = uVar5;
          auVar25._24_4_ = uVar5;
          auVar25._28_4_ = uVar5;
          auVar12 = vsubps_avx(auVar66,auVar25);
          auVar13._4_4_ = uVar6;
          auVar13._0_4_ = uVar6;
          auVar13._8_4_ = uVar6;
          auVar13._12_4_ = uVar6;
          auVar13._16_4_ = uVar6;
          auVar13._20_4_ = uVar6;
          auVar13._24_4_ = uVar6;
          auVar13._28_4_ = uVar6;
          auVar13 = vsubps_avx(auVar73,auVar13);
          auVar59._0_4_ = fVar1 * auVar12._0_4_;
          auVar59._4_4_ = fVar1 * auVar12._4_4_;
          auVar59._8_4_ = fVar1 * auVar12._8_4_;
          auVar59._12_4_ = fVar1 * auVar12._12_4_;
          auVar59._16_4_ = fVar1 * auVar12._16_4_;
          auVar59._20_4_ = fVar1 * auVar12._20_4_;
          auVar59._28_36_ = auVar60._28_36_;
          auVar59._24_4_ = fVar1 * auVar12._24_4_;
          auVar41 = vfmsub231ps_fma(auVar59._0_32_,auVar11,auVar75);
          auVar22._4_4_ = auVar10._4_4_ * auVar41._4_4_;
          auVar22._0_4_ = auVar10._0_4_ * auVar41._0_4_;
          auVar22._8_4_ = auVar10._8_4_ * auVar41._8_4_;
          auVar22._12_4_ = auVar10._12_4_ * auVar41._12_4_;
          auVar22._16_4_ = auVar10._16_4_ * 0.0;
          auVar22._20_4_ = auVar10._20_4_ * 0.0;
          auVar22._24_4_ = auVar10._24_4_ * 0.0;
          auVar22._28_4_ = auVar10._28_4_;
          auVar10._4_4_ = auVar9._4_4_ * auVar41._4_4_;
          auVar10._0_4_ = auVar9._0_4_ * auVar41._0_4_;
          auVar10._8_4_ = auVar9._8_4_ * auVar41._8_4_;
          auVar10._12_4_ = auVar9._12_4_ * auVar41._12_4_;
          auVar10._16_4_ = auVar9._16_4_ * 0.0;
          auVar10._20_4_ = auVar9._20_4_ * 0.0;
          auVar10._24_4_ = auVar9._24_4_ * 0.0;
          auVar10._28_4_ = auVar9._28_4_;
          auVar57._0_4_ = fVar3 * auVar11._0_4_;
          auVar57._4_4_ = fVar3 * auVar11._4_4_;
          auVar57._8_4_ = fVar3 * auVar11._8_4_;
          auVar57._12_4_ = fVar3 * auVar11._12_4_;
          auVar57._16_4_ = fVar3 * auVar11._16_4_;
          auVar57._20_4_ = fVar3 * auVar11._20_4_;
          auVar57._24_4_ = fVar3 * auVar11._24_4_;
          auVar57._28_4_ = 0;
          auVar16 = vfmsub231ps_fma(auVar57,auVar13,auVar74);
          auVar41 = vfmadd231ps_fma(auVar22,ZEXT1632(auVar16),auVar43);
          auVar9._4_4_ = auVar8._4_4_ * auVar43._4_4_;
          auVar9._0_4_ = auVar8._0_4_ * auVar43._0_4_;
          auVar9._8_4_ = auVar8._8_4_ * auVar43._8_4_;
          auVar9._12_4_ = auVar8._12_4_ * auVar43._12_4_;
          auVar9._16_4_ = auVar8._16_4_ * auVar43._16_4_;
          auVar9._20_4_ = auVar8._20_4_ * auVar43._20_4_;
          auVar9._24_4_ = auVar8._24_4_ * auVar43._24_4_;
          auVar9._28_4_ = auVar43._28_4_;
          auVar20 = vfmsub231ps_fma(auVar9,auVar47,auVar49);
          auVar16 = vfmadd231ps_fma(auVar10,auVar49,ZEXT1632(auVar16));
          auVar58._0_4_ = fVar2 * auVar13._0_4_;
          auVar58._4_4_ = fVar2 * auVar13._4_4_;
          auVar58._8_4_ = fVar2 * auVar13._8_4_;
          auVar58._12_4_ = fVar2 * auVar13._12_4_;
          auVar58._16_4_ = fVar2 * auVar13._16_4_;
          auVar58._20_4_ = fVar2 * auVar13._20_4_;
          auVar58._24_4_ = fVar2 * auVar13._24_4_;
          auVar58._28_4_ = 0;
          auVar21 = vfmsub231ps_fma(auVar58,auVar12,auVar68);
          auVar64._0_4_ = fVar3 * auVar20._0_4_;
          auVar64._4_4_ = fVar3 * auVar20._4_4_;
          auVar64._8_4_ = fVar3 * auVar20._8_4_;
          auVar64._12_4_ = fVar3 * auVar20._12_4_;
          auVar64._16_4_ = fVar3 * 0.0;
          auVar64._20_4_ = fVar3 * 0.0;
          auVar64._24_4_ = fVar3 * 0.0;
          auVar64._28_4_ = 0;
          auVar17 = vfmadd231ps_fma(auVar64,ZEXT1632(auVar19),auVar75);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar18),auVar74);
          auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),ZEXT1632(auVar21),auVar47);
          auVar49 = vandps_avx(ZEXT1632(auVar17),auVar42);
          uVar40 = auVar49._0_4_;
          auVar54._0_4_ = (float)(uVar40 ^ auVar41._0_4_);
          uVar44 = auVar49._4_4_;
          auVar54._4_4_ = (float)(uVar44 ^ auVar41._4_4_);
          uVar45 = auVar49._8_4_;
          auVar54._8_4_ = (float)(uVar45 ^ auVar41._8_4_);
          uVar46 = auVar49._12_4_;
          auVar54._12_4_ = (float)(uVar46 ^ auVar41._12_4_);
          auVar43._16_4_ = auVar49._16_4_;
          auVar54._16_4_ = auVar43._16_4_;
          auVar43._20_4_ = auVar49._20_4_;
          auVar54._20_4_ = auVar43._20_4_;
          auVar43._24_4_ = auVar49._24_4_;
          auVar54._24_4_ = auVar43._24_4_;
          auVar43._28_4_ = auVar49._28_4_;
          auVar54._28_4_ = auVar43._28_4_;
          auVar41 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar8,ZEXT1632(auVar21));
          auVar51._0_4_ = (float)(uVar40 ^ auVar41._0_4_);
          auVar51._4_4_ = (float)(uVar44 ^ auVar41._4_4_);
          auVar51._8_4_ = (float)(uVar45 ^ auVar41._8_4_);
          auVar51._12_4_ = (float)(uVar46 ^ auVar41._12_4_);
          auVar51._16_4_ = auVar43._16_4_;
          auVar51._20_4_ = auVar43._20_4_;
          auVar51._24_4_ = auVar43._24_4_;
          auVar51._28_4_ = auVar43._28_4_;
          auVar49 = vcmpps_avx(auVar54,ZEXT832(0) << 0x20,5);
          auVar8 = vcmpps_avx(auVar51,ZEXT832(0) << 0x20,5);
          auVar49 = vandps_avx(auVar8,auVar49);
          auVar60 = ZEXT3264(auVar49);
          auVar8 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar17),4);
          auVar49 = vandps_avx(auVar8,auVar49);
          auVar55._0_4_ = auVar54._0_4_ + auVar51._0_4_;
          auVar55._4_4_ = auVar54._4_4_ + auVar51._4_4_;
          auVar55._8_4_ = auVar54._8_4_ + auVar51._8_4_;
          auVar55._12_4_ = auVar54._12_4_ + auVar51._12_4_;
          auVar55._16_4_ = auVar43._16_4_ + auVar43._16_4_;
          auVar55._20_4_ = auVar43._20_4_ + auVar43._20_4_;
          auVar55._24_4_ = auVar43._24_4_ + auVar43._24_4_;
          auVar55._28_4_ = auVar43._28_4_ + auVar43._28_4_;
          auVar8._8_4_ = 0x7fffffff;
          auVar8._0_8_ = 0x7fffffff7fffffff;
          auVar8._12_4_ = 0x7fffffff;
          auVar8._16_4_ = 0x7fffffff;
          auVar8._20_4_ = 0x7fffffff;
          auVar8._24_4_ = 0x7fffffff;
          auVar8._28_4_ = 0x7fffffff;
          auVar8 = vandps_avx(ZEXT1632(auVar17),auVar8);
          auVar9 = vcmpps_avx(auVar55,auVar8,2);
          auVar47 = auVar9 & auVar49;
          if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar47 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar47 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar47 >> 0x7f,0) != '\0') ||
                (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar47 >> 0xbf,0) != '\0') ||
              (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar47[0x1f] < '\0') {
            auVar49 = vandps_avx(auVar49,auVar9);
            auVar41 = vpackssdw_avx(auVar49._0_16_,auVar49._16_16_);
            auVar48._0_4_ = auVar13._0_4_ * auVar20._0_4_;
            auVar48._4_4_ = auVar13._4_4_ * auVar20._4_4_;
            auVar48._8_4_ = auVar13._8_4_ * auVar20._8_4_;
            auVar48._12_4_ = auVar13._12_4_ * auVar20._12_4_;
            auVar48._16_4_ = auVar13._16_4_ * 0.0;
            auVar48._20_4_ = auVar13._20_4_ * 0.0;
            auVar48._24_4_ = auVar13._24_4_ * 0.0;
            auVar48._28_4_ = 0;
            auVar16 = vfmadd213ps_fma(auVar12,ZEXT1632(auVar19),auVar48);
            auVar16 = vfmadd213ps_fma(auVar11,ZEXT1632(auVar18),ZEXT1632(auVar16));
            auVar43._0_4_ = uVar40 ^ auVar16._0_4_;
            auVar43._4_4_ = uVar44 ^ auVar16._4_4_;
            auVar43._8_4_ = uVar45 ^ auVar16._8_4_;
            auVar43._12_4_ = uVar46 ^ auVar16._12_4_;
            fVar7 = *(float *)(ray + k * 4 + 0x60);
            auVar23._4_4_ = auVar8._4_4_ * fVar7;
            auVar23._0_4_ = auVar8._0_4_ * fVar7;
            auVar23._8_4_ = auVar8._8_4_ * fVar7;
            auVar23._12_4_ = auVar8._12_4_ * fVar7;
            auVar23._16_4_ = auVar8._16_4_ * fVar7;
            auVar23._20_4_ = auVar8._20_4_ * fVar7;
            auVar23._24_4_ = auVar8._24_4_ * fVar7;
            auVar23._28_4_ = fVar7;
            auVar49 = vcmpps_avx(auVar23,auVar43,1);
            fVar7 = *(float *)(ray + k * 4 + 0x100);
            auVar60 = ZEXT3264(CONCAT428(fVar7,CONCAT424(fVar7,CONCAT420(fVar7,CONCAT416(fVar7,
                                                  CONCAT412(fVar7,CONCAT48(fVar7,CONCAT44(fVar7,
                                                  fVar7))))))));
            auVar24._4_4_ = auVar8._4_4_ * fVar7;
            auVar24._0_4_ = auVar8._0_4_ * fVar7;
            auVar24._8_4_ = auVar8._8_4_ * fVar7;
            auVar24._12_4_ = auVar8._12_4_ * fVar7;
            auVar24._16_4_ = auVar8._16_4_ * fVar7;
            auVar24._20_4_ = auVar8._20_4_ * fVar7;
            auVar24._24_4_ = auVar8._24_4_ * fVar7;
            auVar24._28_4_ = auVar8._28_4_;
            auVar8 = vcmpps_avx(auVar43,auVar24,2);
            auVar49 = vandps_avx(auVar49,auVar8);
            auVar16 = vpackssdw_avx(auVar49._0_16_,auVar49._16_16_);
            auVar41 = vpand_avx(auVar16,auVar41);
            auVar49 = vpmovzxwd_avx2(auVar41);
            auVar49 = vpslld_avx2(auVar49,0x1f);
            if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar49 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar49 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar49 >> 0x7f,0) != '\0') ||
                  (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar49 >> 0xbf,0) != '\0') ||
                (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar49[0x1f] < '\0') {
              auVar41 = vpsllw_avx(auVar41,0xf);
              auVar41 = vpacksswb_avx(auVar41,auVar41);
              uVar31 = (ulong)(byte)(SUB161(auVar41 >> 7,0) & 1 |
                                     (SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar41 >> 0x3f,0) << 7);
              do {
                uVar14 = 0;
                for (uVar15 = uVar31; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000)
                {
                  uVar14 = uVar14 + 1;
                }
                if ((((context->scene->geometries).items[*(uint *)((long)&local_820 + uVar14 * 4)].
                     ptr)->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  if (bVar39) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                    uVar36 = 1;
                  }
                  goto LAB_005ee77c;
                }
                uVar31 = uVar31 ^ 1L << (uVar14 & 0x3f);
              } while (uVar31 != 0);
            }
          }
          uVar37 = uVar37 + 1;
          bVar39 = uVar37 < uVar29;
        } while (uVar37 != uVar29);
      }
    }
LAB_005ee77c:
  } while ((uVar36 & 3) == 0);
  return puVar27 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }